

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

uint8 * __thiscall
rw::ps2::MatPipeline::collectData
          (MatPipeline *this,Geometry *g,InstanceData *inst,Mesh *m,uint8 **data)

{
  uint32 uVar1;
  int iVar2;
  void *__dest;
  uint32 uVar3;
  uint i;
  uint8 *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  uint i_1;
  uint uVar9;
  uint8 *puVar10;
  byte bVar11;
  InstMeshInfo im;
  uint8 *datap [10];
  InstMeshInfo local_d8;
  long local_88 [11];
  
  bVar11 = 0;
  getInstMeshInfo(&local_d8,this,g,m);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2.cpp line: 769"
  ;
  puVar4 = (uint8 *)(*DAT_00149da8)(m->numIndices * local_d8.vertexSize,0x3000f);
  lVar5 = 0;
  puVar10 = puVar4;
  do {
    if (this->attribs[lVar5] != (PipeAttribute *)0x0) {
      uVar7 = this->attribs[lVar5]->attrib;
      if ((uVar7 & 6) == 0) {
        data[lVar5] = puVar10;
        puVar10 = puVar10 + (((uVar7 >> 0x1a & 3) + 1) *
                             *(int *)(attribSize(unsigned_int)::size + (uVar7 >> 0x16 & 0xc)) >> 3)
                            * m->numIndices;
      }
      else {
        data[lVar5] = inst->data + (local_d8.attribPos[lVar5] << 4);
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  plVar8 = local_88;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *plVar8 = (long)*data;
    data = data + (ulong)bVar11 * -2 + 1;
    plVar8 = plVar8 + (ulong)bVar11 * -2 + 1;
  }
  uVar1 = g->meshHeader->flags;
  if (local_d8.numBatches != 0) {
    puVar10 = inst->data + (ulong)(local_d8.numBrokenAttribs == 0) * 0x10;
    uVar7 = 0;
    do {
      lVar5 = 4;
      do {
        if (this->attribs[lVar5 + -4] != (PipeAttribute *)0x0) {
          puVar10 = puVar10 + (ulong)((this->attribs[lVar5 + -4]->attrib & 6) != 0) * 0x20;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0xe);
      uVar3 = local_d8.lastBatchVertCount;
      if (uVar7 < local_d8.numBatches - 1) {
        uVar3 = local_d8.batchVertCount;
      }
      puVar10 = puVar10 + (ulong)(local_d8.numBrokenAttribs != 0) * 0x10;
      lVar5 = 0;
      do {
        if (this->attribs[lVar5] != (PipeAttribute *)0x0) {
          uVar6 = this->attribs[lVar5]->attrib;
          if ((uVar6 & 6) == 0) {
            iVar2 = *(int *)(attribSize(unsigned_int)::size + (uVar6 >> 0x16 & 0xc));
            if ((*(uint *)(puVar10 + 0xc) & 0xff004000) != uVar6) {
              fprintf(_stderr,"unexpected unpack: %08x %08x\n");
            }
            uVar6 = ((uVar6 >> 0x1a & 3) + 1) * iVar2 >> 3;
            __dest = (void *)local_88[lVar5];
            uVar9 = uVar6 * uVar3;
            memcpy(__dest,puVar10 + 0x10,(ulong)uVar9);
            local_88[lVar5] = (ulong)(uVar6 * ((uint)(uVar1 != 1) * 2 + -2 + uVar3)) + (long)__dest;
            puVar10 = puVar10 + 0x10 + (uVar9 + 0xf & 0xfffffff0);
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
      puVar10 = puVar10 + 0x10;
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_d8.numBatches);
  }
  return puVar4;
}

Assistant:

uint8*
MatPipeline::collectData(Geometry *g, InstanceData *inst, Mesh *m, uint8 *data[])
{
	PipeAttribute *a;
	InstMeshInfo im = getInstMeshInfo(this, g, m);

	uint8 *raw = rwNewT(uint8, im.vertexSize*m->numIndices, MEMDUR_EVENT | ID_GEOMETRY);
	uint8 *dp = raw;
	for(uint i = 0; i < nelem(this->attribs); i++)
		if((a = this->attribs[i])) {
			if(a->attrib & AT_RW){
				data[i] = inst->data + im.attribPos[i]*0x10;
			}else{
				data[i] = dp;
				dp += m->numIndices*attribSize(a->attrib);
			}
		}

	uint8 *datap[nelem(this->attribs)];
	memcpy(datap, data, sizeof(datap));

	uint32 overlap = g->meshHeader->flags == 1 ? 2 : 0;
	uint32 *p = (uint32*)inst->data;
	if(im.numBrokenAttribs == 0)
		p += 4;
	for(uint32 j = 0; j < im.numBatches; j++){
		uint32 nverts = j < im.numBatches-1 ? im.batchVertCount :
		                                      im.lastBatchVertCount;
		for(uint i = 0; i < nelem(this->attribs); i++)
			if((a = this->attribs[i]) && a->attrib & AT_RW)
				p += 8;
		if(im.numBrokenAttribs)
			p += 4;
		for(uint i = 0; i < nelem(this->attribs); i++)
			if((a = this->attribs[i]) && (a->attrib & AT_RW) == 0){
				uint32 asz = attribSize(a->attrib);
				p += 4;
				if((p[-1] & 0xff004000) != a->attrib){
					fprintf(stderr, "unexpected unpack: %08x %08x\n", p[-1], a->attrib);
					assert(0 && "unexpected unpack\n");
				}
				memcpy(datap[i], p, asz*nverts);
				datap[i] += asz*(nverts-overlap);
				p += QWC(asz*nverts)*4;
			}
		p += 4;
	}
	return raw;
}